

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chariterators.h
# Opt level: O2

uint32_t __thiscall
utf8iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::operator*(utf8iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *this)

{
  byte bVar1;
  byte *pbVar2;
  uint uVar3;
  uint32_t uVar4;
  int iVar5;
  long lVar6;
  
  pbVar2 = (byte *)(this->_ptr)._M_current;
  bVar1 = *pbVar2;
  if (bVar1 < 0xf0) {
    if (bVar1 < 0xe0) {
      if (bVar1 < 0xc0) {
        uVar4 = 0;
        if (-1 < (char)bVar1) {
          uVar4 = (uint)bVar1;
        }
        return uVar4;
      }
      iVar5 = 1;
      uVar3 = 0x1f;
    }
    else {
      iVar5 = 2;
      uVar3 = 0xf;
    }
  }
  else {
    iVar5 = 3;
    uVar3 = 7;
  }
  uVar3 = uVar3 & bVar1;
  for (lVar6 = 0; iVar5 != (int)lVar6; lVar6 = lVar6 + 1) {
    uVar3 = uVar3 << 6 | (pbVar2 + 1)[lVar6] & 0x3f;
  }
  return uVar3;
}

Assistant:

uint32_t operator*() const
    {
        P p=_ptr;
        uint8_t b0= *p++;
        uint32_t c;
        int n;
        if (b0>=0xf0) {
            c= b0&7;
            n=3;
        }
        else if (b0>=0xe0) {
            c= b0&15;
            n=2;
        }
        else if (b0>=0xc0) {
            c= b0&31;
            n=1;
        }
        else if (b0>=0x80) {
            return 0;
        }
        else {
            return b0;
        }
        while (n--) {
            c <<= 6;
            c |= *p++ & 0x3f;
        }
        return c;
    }